

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktWsiSwapchainTests.cpp
# Opt level: O0

Move<vk::Handle<(vk::HandleType)18>_> *
vkt::wsi::anon_unknown_0::TriangleRenderer::createPipeline
          (Move<vk::Handle<(vk::HandleType)18>_> *__return_storage_ptr__,DeviceInterface *vkd,
          VkDevice device,VkRenderPass renderPass,VkPipelineLayout pipelineLayout,
          BinaryCollection *binaryCollection,UVec2 *renderSize)

{
  RefData<vk::Handle<(vk::HandleType)14>_> data;
  RefData<vk::Handle<(vk::HandleType)14>_> data_00;
  VkAllocationCallbacks *this;
  uint uVar1;
  ProgramBinary *pPVar2;
  Handle<(vk::HandleType)14> *pHVar3;
  VkPipelineCache local_478;
  undefined1 local_470 [8];
  VkGraphicsPipelineCreateInfo pipelineParams;
  VkPipelineColorBlendStateCreateInfo blendParams;
  VkPipelineColorBlendAttachmentState attBlendParams0;
  VkPipelineVertexInputStateCreateInfo vertexInputStateParams;
  VkVertexInputAttributeDescription vertexAttrib0;
  VkVertexInputBindingDescription vertexBinding0;
  VkPipelineInputAssemblyStateCreateInfo inputAssemblyParams;
  VkPipelineRasterizationStateCreateInfo rasterParams;
  VkPipelineMultisampleStateCreateInfo multisampleParams;
  undefined1 local_2a0 [8];
  VkPipelineViewportStateCreateInfo viewportParams;
  VkRect2D scissor0;
  VkViewport viewport0;
  VkPipelineDepthStencilStateCreateInfo depthStencilParams;
  undefined4 local_1d8 [2];
  VkPipelineShaderStageCreateInfo shaderStageParams [2];
  VkSpecializationInfo emptyShaderSpecParams;
  string local_150;
  Move<vk::Handle<(vk::HandleType)14>_> local_130;
  RefData<vk::Handle<(vk::HandleType)14>_> local_110;
  undefined1 local_f0 [8];
  Unique<vk::Handle<(vk::HandleType)14>_> fragShaderModule;
  allocator<char> local_b9;
  string local_b8;
  Move<vk::Handle<(vk::HandleType)14>_> local_98;
  RefData<vk::Handle<(vk::HandleType)14>_> local_78;
  undefined1 local_58 [8];
  Unique<vk::Handle<(vk::HandleType)14>_> vertShaderModule;
  BinaryCollection *binaryCollection_local;
  VkDevice device_local;
  DeviceInterface *vkd_local;
  VkPipelineLayout pipelineLayout_local;
  VkRenderPass renderPass_local;
  
  vertShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)binaryCollection;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"tri-vert",&local_b9);
  pPVar2 = ::vk::ProgramCollection<vk::ProgramBinary>::get(binaryCollection,&local_b8);
  ::vk::createShaderModule(&local_98,vkd,device,pPVar2,0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_78,(Move *)&local_98);
  data.deleter.m_deviceIface = local_78.deleter.m_deviceIface;
  data.object.m_internal = local_78.object.m_internal;
  data.deleter.m_device = local_78.deleter.m_device;
  data.deleter.m_allocator = local_78.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_58,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)14>_>::~Move(&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator(&local_b9);
  this = vertShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_150,"tri-frag",
             (allocator<char> *)((long)&emptyShaderSpecParams.pData + 7));
  pPVar2 = ::vk::ProgramCollection<vk::ProgramBinary>::get
                     ((ProgramCollection<vk::ProgramBinary> *)this,&local_150);
  ::vk::createShaderModule(&local_130,vkd,device,pPVar2,0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_110,(Move *)&local_130);
  data_00.deleter.m_deviceIface = local_110.deleter.m_deviceIface;
  data_00.object.m_internal = local_110.object.m_internal;
  data_00.deleter.m_device = local_110.deleter.m_device;
  data_00.deleter.m_allocator = local_110.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_f0,data_00);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)14>_>::~Move(&local_130);
  std::__cxx11::string::~string((string *)&local_150);
  std::allocator<char>::~allocator((allocator<char> *)((long)&emptyShaderSpecParams.pData + 7));
  emptyShaderSpecParams.pMapEntries = (VkSpecializationMapEntry *)0x0;
  emptyShaderSpecParams.dataSize = 0;
  shaderStageParams[1].pSpecializationInfo = (VkSpecializationInfo *)0x0;
  emptyShaderSpecParams.mapEntryCount = 0;
  emptyShaderSpecParams._4_4_ = 0;
  local_1d8[0] = 0x12;
  shaderStageParams[0].sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  shaderStageParams[0]._4_4_ = 0;
  shaderStageParams[0].pNext._0_4_ = 0;
  shaderStageParams[0].pNext._4_4_ = 1;
  pHVar3 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)14>_> *)local_58);
  shaderStageParams[0]._16_8_ = pHVar3->m_internal;
  shaderStageParams[0].module.m_internal = (long)"pre_main" + 4;
  shaderStageParams[0].pSpecializationInfo._0_4_ = 0x12;
  shaderStageParams[1].sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  shaderStageParams[1]._4_4_ = 0;
  shaderStageParams[1].pNext._0_4_ = 0;
  shaderStageParams[1].pNext._4_4_ = 0x10;
  shaderStageParams[0].pName = (char *)&shaderStageParams[1].pSpecializationInfo;
  pHVar3 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)14>_> *)local_f0);
  shaderStageParams[1]._16_8_ = pHVar3->m_internal;
  shaderStageParams[1].module.m_internal = (long)"pre_main" + 4;
  viewport0.minDepth = 3.50325e-44;
  viewport0.maxDepth = 0.0;
  scissor0.extent.width = 0;
  scissor0.extent.height = 0;
  shaderStageParams[1].pName = (char *)&shaderStageParams[1].pSpecializationInfo;
  uVar1 = tcu::Vector<unsigned_int,_2>::x(renderSize);
  viewport0.x = (float)uVar1;
  uVar1 = tcu::Vector<unsigned_int,_2>::y(renderSize);
  viewport0.y = (float)uVar1;
  viewport0.width = 0.0;
  viewport0.height = 1.0;
  viewportParams.pScissors._0_4_ = 0;
  viewportParams.pScissors._4_4_ = 0;
  scissor0.offset.x = tcu::Vector<unsigned_int,_2>::x(renderSize);
  scissor0.offset.y = tcu::Vector<unsigned_int,_2>::y(renderSize);
  local_2a0._0_4_ = VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_STATE_CREATE_INFO;
  viewportParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  viewportParams._4_4_ = 0;
  viewportParams.pNext._0_4_ = 0;
  viewportParams.pNext._4_4_ = 1;
  viewportParams._16_8_ = &scissor0.extent;
  viewportParams.pViewports._0_4_ = 1;
  viewportParams._32_8_ = &viewportParams.pScissors;
  rasterParams.lineWidth = 3.36312e-44;
  rasterParams._60_4_ = 0;
  rasterParams.depthBiasEnable = 0;
  rasterParams.depthBiasConstantFactor = 0.0;
  rasterParams.rasterizerDiscardEnable = 0;
  rasterParams.polygonMode = VK_POLYGON_MODE_FILL;
  rasterParams.cullMode = 0;
  rasterParams.frontFace = VK_FRONT_FACE_COUNTER_CLOCKWISE;
  rasterParams.pNext = (void *)0x0;
  rasterParams.flags = 0;
  rasterParams.depthClampEnable = 0;
  rasterParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  rasterParams._4_4_ = 0;
  inputAssemblyParams.primitiveRestartEnable = 0x17;
  inputAssemblyParams._28_4_ = 0;
  rasterParams.depthBiasClamp = 1.0;
  rasterParams.depthBiasSlopeFactor = 0.0;
  inputAssemblyParams.pNext = (void *)0x300000000;
  inputAssemblyParams.flags = 0;
  inputAssemblyParams.topology = VK_PRIMITIVE_TOPOLOGY_POINT_LIST;
  stack0xfffffffffffffcc8 = 0x14;
  inputAssemblyParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  inputAssemblyParams._4_4_ = 0;
  vertexAttrib0.format = VK_FORMAT_UNDEFINED;
  vertexAttrib0.offset = 0x10;
  vertexBinding0.binding = 0;
  vertexInputStateParams.pVertexAttributeDescriptions = (VkVertexInputAttributeDescription *)0x0;
  vertexAttrib0.location = 0x6d;
  vertexAttrib0.binding = 0;
  attBlendParams0.alphaBlendOp = 0x13;
  vertexInputStateParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  vertexInputStateParams._4_4_ = 0;
  vertexInputStateParams.pNext._0_4_ = 0;
  vertexInputStateParams.pNext._4_4_ = 1;
  vertexInputStateParams._16_8_ = &vertexAttrib0.format;
  vertexInputStateParams.pVertexBindingDescriptions._0_4_ = 1;
  vertexInputStateParams._32_8_ = &vertexInputStateParams.pVertexAttributeDescriptions;
  attBlendParams0.dstColorBlendFactor = VK_BLEND_FACTOR_ONE;
  attBlendParams0.colorBlendOp = VK_BLEND_OP_ADD;
  attBlendParams0.srcAlphaBlendFactor = VK_BLEND_FACTOR_ZERO;
  attBlendParams0.dstAlphaBlendFactor = VK_BLEND_FACTOR_SRC1_COLOR;
  blendParams.blendConstants[2] = 0.0;
  blendParams.blendConstants[3] = 1.4013e-45;
  attBlendParams0.blendEnable = 0;
  attBlendParams0.srcColorBlendFactor = VK_BLEND_FACTOR_ZERO;
  pipelineParams.basePipelineIndex = 0x1a;
  blendParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  blendParams._4_4_ = 0;
  blendParams.pNext._0_4_ = 0;
  blendParams.pNext._4_4_ = 0;
  blendParams.flags = 3;
  blendParams.logicOpEnable = 1;
  blendParams._24_8_ = blendParams.blendConstants + 2;
  blendParams.pAttachments._0_4_ = 0;
  blendParams.pAttachments._4_4_ = 0;
  blendParams.blendConstants[0] = 0.0;
  blendParams.blendConstants[1] = 0.0;
  local_470._0_4_ = VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_CREATE_INFO;
  pipelineParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  pipelineParams._4_4_ = 0;
  pipelineParams.pNext._0_4_ = 0;
  pipelineParams.pNext._4_4_ = 2;
  pipelineParams._16_8_ = local_1d8;
  pipelineParams.pStages = (VkPipelineShaderStageCreateInfo *)&attBlendParams0.alphaBlendOp;
  pipelineParams.pVertexInputState =
       (VkPipelineVertexInputStateCreateInfo *)&vertexBinding0.inputRate;
  pipelineParams.pInputAssemblyState = (VkPipelineInputAssemblyStateCreateInfo *)0x0;
  pipelineParams.pTessellationState = (VkPipelineTessellationStateCreateInfo *)local_2a0;
  pipelineParams.pViewportState =
       (VkPipelineViewportStateCreateInfo *)&inputAssemblyParams.primitiveRestartEnable;
  pipelineParams.pRasterizationState =
       (VkPipelineRasterizationStateCreateInfo *)&rasterParams.lineWidth;
  pipelineParams.pMultisampleState = (VkPipelineMultisampleStateCreateInfo *)&viewport0.minDepth;
  pipelineParams.pDepthStencilState =
       (VkPipelineDepthStencilStateCreateInfo *)&pipelineParams.basePipelineIndex;
  pipelineParams.pColorBlendState = (VkPipelineColorBlendStateCreateInfo *)0x0;
  pipelineParams.renderPass.m_internal._0_4_ = 0;
  pipelineParams.pDynamicState = (VkPipelineDynamicStateCreateInfo *)pipelineLayout.m_internal;
  pipelineParams.layout.m_internal = renderPass.m_internal;
  ::vk::Handle<(vk::HandleType)18>::Handle((Handle<(vk::HandleType)18> *)&pipelineParams.subpass,0);
  pipelineParams.basePipelineHandle.m_internal._0_4_ = 0;
  ::vk::Handle<(vk::HandleType)15>::Handle(&local_478,0);
  ::vk::createGraphicsPipeline
            (__return_storage_ptr__,vkd,device,local_478,(VkGraphicsPipelineCreateInfo *)local_470,
             (VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_f0);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_58);
  return __return_storage_ptr__;
}

Assistant:

Move<VkPipeline> TriangleRenderer::createPipeline (const DeviceInterface&	vkd,
												   const VkDevice			device,
												   const VkRenderPass		renderPass,
												   const VkPipelineLayout	pipelineLayout,
												   const BinaryCollection&	binaryCollection,
												   const UVec2&				renderSize)
{
	// \note VkShaderModules are fully consumed by vkCreateGraphicsPipelines()
	//		 and can be deleted immediately following that call.
	const Unique<VkShaderModule>					vertShaderModule		(createShaderModule(vkd, device, binaryCollection.get("tri-vert"), 0));
	const Unique<VkShaderModule>					fragShaderModule		(createShaderModule(vkd, device, binaryCollection.get("tri-frag"), 0));

	const VkSpecializationInfo						emptyShaderSpecParams	=
	{
		0u,											// mapEntryCount
		DE_NULL,									// pMap
		0,											// dataSize
		DE_NULL,									// pData
	};
	const VkPipelineShaderStageCreateInfo			shaderStageParams[]		=
	{
		{
			VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO,
			DE_NULL,
			(VkPipelineShaderStageCreateFlags)0,
			VK_SHADER_STAGE_VERTEX_BIT,
			*vertShaderModule,
			"main",
			&emptyShaderSpecParams,
		},
		{
			VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO,
			DE_NULL,
			(VkPipelineShaderStageCreateFlags)0,
			VK_SHADER_STAGE_FRAGMENT_BIT,
			*fragShaderModule,
			"main",
			&emptyShaderSpecParams,
		}
	};
	const VkPipelineDepthStencilStateCreateInfo		depthStencilParams		=
	{
		VK_STRUCTURE_TYPE_PIPELINE_DEPTH_STENCIL_STATE_CREATE_INFO,
		DE_NULL,
		(VkPipelineDepthStencilStateCreateFlags)0,
		DE_FALSE,									// depthTestEnable
		DE_FALSE,									// depthWriteEnable
		VK_COMPARE_OP_ALWAYS,						// depthCompareOp
		DE_FALSE,									// depthBoundsTestEnable
		DE_FALSE,									// stencilTestEnable
		{
			VK_STENCIL_OP_KEEP,							// failOp
			VK_STENCIL_OP_KEEP,							// passOp
			VK_STENCIL_OP_KEEP,							// depthFailOp
			VK_COMPARE_OP_ALWAYS,						// compareOp
			0u,											// compareMask
			0u,											// writeMask
			0u,											// reference
		},											// front
		{
			VK_STENCIL_OP_KEEP,							// failOp
			VK_STENCIL_OP_KEEP,							// passOp
			VK_STENCIL_OP_KEEP,							// depthFailOp
			VK_COMPARE_OP_ALWAYS,						// compareOp
			0u,											// compareMask
			0u,											// writeMask
			0u,											// reference
		},											// back
		-1.0f,										// minDepthBounds
		+1.0f,										// maxDepthBounds
	};
	const VkViewport								viewport0				=
	{
		0.0f,										// x
		0.0f,										// y
		(float)renderSize.x(),						// width
		(float)renderSize.y(),						// height
		0.0f,										// minDepth
		1.0f,										// maxDepth
	};
	const VkRect2D									scissor0				=
	{
		{ 0u, 0u, },								// offset
		{ renderSize.x(), renderSize.y() },			// extent
	};
	const VkPipelineViewportStateCreateInfo			viewportParams			=
	{
		VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_STATE_CREATE_INFO,
		DE_NULL,
		(VkPipelineViewportStateCreateFlags)0,
		1u,
		&viewport0,
		1u,
		&scissor0
	};
	const VkPipelineMultisampleStateCreateInfo		multisampleParams		=
	{
		VK_STRUCTURE_TYPE_PIPELINE_MULTISAMPLE_STATE_CREATE_INFO,
		DE_NULL,
		(VkPipelineMultisampleStateCreateFlags)0,
		VK_SAMPLE_COUNT_1_BIT,						// rasterizationSamples
		VK_FALSE,									// sampleShadingEnable
		0.0f,										// minSampleShading
		(const VkSampleMask*)DE_NULL,				// sampleMask
		VK_FALSE,									// alphaToCoverageEnable
		VK_FALSE,									// alphaToOneEnable
	};
	const VkPipelineRasterizationStateCreateInfo	rasterParams			=
	{
		VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_STATE_CREATE_INFO,
		DE_NULL,
		(VkPipelineRasterizationStateCreateFlags)0,
		VK_FALSE,									// depthClampEnable
		VK_FALSE,									// rasterizerDiscardEnable
		VK_POLYGON_MODE_FILL,						// polygonMode
		VK_CULL_MODE_NONE,							// cullMode
		VK_FRONT_FACE_COUNTER_CLOCKWISE,			// frontFace
		VK_FALSE,									// depthBiasEnable
		0.0f,										// depthBiasConstantFactor
		0.0f,										// depthBiasClamp
		0.0f,										// depthBiasSlopeFactor
		1.0f,										// lineWidth
	};
	const VkPipelineInputAssemblyStateCreateInfo	inputAssemblyParams		=
	{
		VK_STRUCTURE_TYPE_PIPELINE_INPUT_ASSEMBLY_STATE_CREATE_INFO,
		DE_NULL,
		(VkPipelineInputAssemblyStateCreateFlags)0,
		VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST,
		DE_FALSE,									// primitiveRestartEnable
	};
	const VkVertexInputBindingDescription			vertexBinding0			=
	{
		0u,											// binding
		(deUint32)sizeof(tcu::Vec4),				// stride
		VK_VERTEX_INPUT_RATE_VERTEX,				// inputRate
	};
	const VkVertexInputAttributeDescription			vertexAttrib0			=
	{
		0u,											// location
		0u,											// binding
		VK_FORMAT_R32G32B32A32_SFLOAT,				// format
		0u,											// offset
	};
	const VkPipelineVertexInputStateCreateInfo		vertexInputStateParams	=
	{
		VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_STATE_CREATE_INFO,
		DE_NULL,
		(VkPipelineVertexInputStateCreateFlags)0,
		1u,
		&vertexBinding0,
		1u,
		&vertexAttrib0,
	};
	const VkPipelineColorBlendAttachmentState		attBlendParams0			=
	{
		VK_FALSE,									// blendEnable
		VK_BLEND_FACTOR_ONE,						// srcColorBlendFactor
		VK_BLEND_FACTOR_ZERO,						// dstColorBlendFactor
		VK_BLEND_OP_ADD,							// colorBlendOp
		VK_BLEND_FACTOR_ONE,						// srcAlphaBlendFactor
		VK_BLEND_FACTOR_ZERO,						// dstAlphaBlendFactor
		VK_BLEND_OP_ADD,							// alphaBlendOp
		(VK_COLOR_COMPONENT_R_BIT|
		 VK_COLOR_COMPONENT_G_BIT|
		 VK_COLOR_COMPONENT_B_BIT|
		 VK_COLOR_COMPONENT_A_BIT),					// colorWriteMask
	};
	const VkPipelineColorBlendStateCreateInfo		blendParams				=
	{
		VK_STRUCTURE_TYPE_PIPELINE_COLOR_BLEND_STATE_CREATE_INFO,
		DE_NULL,
		(VkPipelineColorBlendStateCreateFlags)0,
		VK_FALSE,									// logicOpEnable
		VK_LOGIC_OP_COPY,
		1u,
		&attBlendParams0,
		{ 0.0f, 0.0f, 0.0f, 0.0f },					// blendConstants[4]
	};
	const VkGraphicsPipelineCreateInfo				pipelineParams			=
	{
		VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_CREATE_INFO,
		DE_NULL,
		(VkPipelineCreateFlags)0,
		(deUint32)DE_LENGTH_OF_ARRAY(shaderStageParams),
		shaderStageParams,
		&vertexInputStateParams,
		&inputAssemblyParams,
		(const VkPipelineTessellationStateCreateInfo*)DE_NULL,
		&viewportParams,
		&rasterParams,
		&multisampleParams,
		&depthStencilParams,
		&blendParams,
		(const VkPipelineDynamicStateCreateInfo*)DE_NULL,
		pipelineLayout,
		renderPass,
		0u,											// subpass
		DE_NULL,									// basePipelineHandle
		0u,											// basePipelineIndex
	};

	return vk::createGraphicsPipeline(vkd, device, (VkPipelineCache)0, &pipelineParams);
}